

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack1to4.h
# Opt level: O1

void ncnn::conv3x3s2_pack1to4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined4 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint uVar27;
  uint uVar28;
  int iVar29;
  int iVar30;
  void *pvVar31;
  float fVar32;
  float fVar39;
  float fVar40;
  float fVar44;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined1 (*pauVar66) [16];
  uint uVar67;
  uint uVar68;
  ulong uVar69;
  long lVar70;
  undefined1 (*pauVar71) [16];
  undefined1 (*pauVar72) [16];
  int iVar73;
  undefined4 *puVar74;
  float *pfVar75;
  float *pfVar76;
  int iVar77;
  void *pvVar78;
  ulong uVar79;
  undefined4 *puVar80;
  ulong uVar81;
  ulong uVar82;
  undefined1 (*pauVar83) [16];
  float *pfVar84;
  ulong uVar85;
  void *pvVar86;
  long lVar87;
  void *pvVar88;
  float *pfVar89;
  undefined4 *puVar90;
  long lVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined4 uVar97;
  undefined4 uVar98;
  undefined4 uVar99;
  undefined4 uVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  ulong local_148;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 *local_98;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  
  uVar27 = bottom_blob->c;
  uVar28 = top_blob->w;
  iVar29 = top_blob->h;
  iVar30 = top_blob->c;
  pvVar31 = _bias->data;
  uVar82 = (long)iVar30 & 0xfffffffffffffffe;
  lVar91 = (long)(int)(((bottom_blob->w - uVar28) - uVar28) + bottom_blob->w);
  if (0 < iVar30 >> 1) {
    uVar85 = 0;
    do {
      uVar79 = (long)top_blob->h * (long)top_blob->w;
      uVar69 = top_blob->elemsize;
      uVar81 = (uVar69 * uVar79 + 0xf & 0xfffffffffffffff0) / uVar69;
      if (top_blob->dims == 4) {
        uVar81 = uVar79;
      }
      auVar92 = ZEXT816(0) << 0x40;
      uVar97 = 0;
      uVar98 = 0;
      uVar99 = 0;
      uVar100 = 0;
      if (pvVar31 != (void *)0x0) {
        puVar74 = (undefined4 *)((long)pvVar31 + uVar85 * 0x20);
        uVar97 = *puVar74;
        uVar98 = puVar74[1];
        uVar99 = puVar74[2];
        uVar100 = puVar74[3];
      }
      lVar70 = uVar69 * top_blob->cstep;
      pvVar78 = top_blob->data;
      lVar87 = uVar85 * 2 + 1;
      iVar73 = top_blob->d;
      if (pvVar31 != (void *)0x0) {
        auVar92 = *(undefined1 (*) [16])((long)pvVar31 + lVar87 * 0x10);
      }
      puVar80 = (undefined4 *)(lVar70 * uVar85 * 2 + (long)pvVar78);
      iVar77 = iVar73 * (int)uVar81;
      puVar74 = puVar80;
      if (0 < iVar77) {
        do {
          *puVar74 = uVar97;
          puVar74[1] = uVar98;
          puVar74[2] = uVar99;
          puVar74[3] = uVar100;
          iVar77 = iVar77 + -1;
          puVar74 = puVar74 + 4;
        } while (iVar77 != 0);
      }
      pauVar72 = (undefined1 (*) [16])((long)pvVar78 + lVar70 * lVar87);
      iVar73 = iVar73 * (int)uVar81;
      pauVar83 = pauVar72;
      if (0 < iVar73) {
        do {
          *pauVar83 = auVar92;
          iVar73 = iVar73 + -1;
          pauVar83 = pauVar83 + 1;
        } while (iVar73 != 0);
      }
      if (0 < (int)uVar27) {
        pfVar75 = (float *)(lVar87 * kernel->elemsize * kernel->cstep + (long)kernel->data);
        local_98 = (undefined8 *)
                   (uVar85 * 2 * kernel->cstep * kernel->elemsize + (long)kernel->data);
        local_148 = 0;
        do {
          if (0 < iVar29) {
            uVar62 = *local_98;
            uVar63 = local_98[1];
            auVar92 = *(undefined1 (*) [16])(local_98 + 2);
            auVar20 = *(undefined1 (*) [16])(local_98 + 4);
            auVar21 = *(undefined1 (*) [16])(local_98 + 6);
            auVar22 = *(undefined1 (*) [16])(local_98 + 8);
            auVar23 = *(undefined1 (*) [16])(local_98 + 10);
            auVar24 = *(undefined1 (*) [16])(local_98 + 0xc);
            auVar25 = *(undefined1 (*) [16])(local_98 + 0xe);
            auVar93 = *(undefined1 (*) [16])(local_98 + 0x10);
            fVar58 = *pfVar75;
            fVar59 = pfVar75[1];
            fVar60 = pfVar75[2];
            fVar61 = pfVar75[3];
            fVar38 = pfVar75[4];
            fVar37 = pfVar75[5];
            fVar36 = pfVar75[6];
            fVar35 = pfVar75[7];
            fVar54 = pfVar75[8];
            fVar55 = pfVar75[9];
            fVar56 = pfVar75[10];
            fVar57 = pfVar75[0xb];
            auVar94 = *(undefined1 (*) [16])(pfVar75 + 0xc);
            auVar107 = ZEXT1664(auVar94);
            fVar34 = pfVar75[0x10];
            fVar33 = pfVar75[0x11];
            fVar32 = pfVar75[0x12];
            fVar39 = pfVar75[0x13];
            auVar95 = *(undefined1 (*) [16])(pfVar75 + 0x14);
            auVar96 = *(undefined1 (*) [16])(pfVar75 + 0x18);
            pvVar86 = (void *)(bottom_blob->cstep * local_148 * bottom_blob->elemsize +
                              (long)bottom_blob->data);
            lVar87 = (long)bottom_blob->w * bottom_blob->elemsize;
            pvVar78 = (void *)((long)pvVar86 + lVar87 * 2);
            pvVar88 = (void *)(lVar87 + (long)pvVar86);
            iVar73 = 0;
            uVar64 = *(undefined8 *)(pfVar75 + 0x1c);
            uVar65 = *(undefined8 *)(pfVar75 + 0x1e);
            auVar26 = *(undefined1 (*) [16])(pfVar75 + 0x20);
            puVar74 = puVar80;
            pauVar83 = pauVar72;
            do {
              local_218 = (float)uVar62;
              fStack_210 = (float)uVar63;
              local_188 = auVar92._0_4_;
              fStack_180 = auVar92._8_4_;
              fStack_17c = auVar92._12_4_;
              local_178 = auVar20._0_4_;
              fStack_170 = auVar20._8_4_;
              fStack_16c = auVar20._12_4_;
              local_198 = auVar21._0_4_;
              fStack_190 = auVar21._8_4_;
              fStack_18c = auVar21._12_4_;
              local_f8 = auVar22._0_4_;
              fStack_f4 = auVar22._4_4_;
              fStack_f0 = auVar22._8_4_;
              fStack_ec = auVar22._12_4_;
              local_1b8 = auVar23._0_4_;
              fStack_1b0 = auVar23._8_4_;
              fStack_1ac = auVar23._12_4_;
              local_1a8 = auVar24._0_4_;
              fStack_1a0 = auVar24._8_4_;
              fStack_19c = auVar24._12_4_;
              local_108 = auVar25._0_4_;
              fStack_104 = auVar25._4_4_;
              fStack_100 = auVar25._8_4_;
              fStack_fc = auVar25._12_4_;
              local_138 = auVar94._0_4_;
              fStack_134 = auVar94._4_4_;
              fStack_130 = auVar94._8_4_;
              fStack_12c = auVar94._12_4_;
              local_e8 = auVar93._0_4_;
              fStack_e4 = auVar93._4_4_;
              fStack_e0 = auVar93._8_4_;
              fStack_dc = auVar93._12_4_;
              local_208 = auVar95._0_4_;
              fStack_200 = auVar95._8_4_;
              fStack_1fc = auVar95._12_4_;
              local_118 = auVar96._0_4_;
              fStack_114 = auVar96._4_4_;
              fStack_110 = auVar96._8_4_;
              fStack_10c = auVar96._12_4_;
              local_158 = (float)uVar64;
              fStack_150 = (float)uVar65;
              local_168 = auVar26._0_4_;
              fStack_160 = auVar26._8_4_;
              fStack_15c = auVar26._12_4_;
              fStack_214 = (float)((ulong)uVar62 >> 0x20);
              fStack_20c = (float)((ulong)uVar63 >> 0x20);
              fStack_184 = auVar92._4_4_;
              fStack_174 = auVar20._4_4_;
              fStack_194 = auVar21._4_4_;
              fStack_1b4 = auVar23._4_4_;
              fStack_1a4 = auVar24._4_4_;
              fStack_204 = auVar95._4_4_;
              fStack_154 = (float)((ulong)uVar64 >> 0x20);
              fStack_14c = (float)((ulong)uVar65 >> 0x20);
              fStack_164 = auVar26._4_4_;
              if ((int)uVar28 < 4) {
                uVar68 = 0;
              }
              else {
                iVar77 = 3;
                lVar87 = 0;
                pauVar66 = pauVar83;
                puVar1 = puVar74;
                do {
                  puVar90 = puVar1;
                  pauVar71 = pauVar66;
                  fVar2 = *(float *)((long)pvVar86 + lVar87);
                  fVar3 = *(float *)((long)pvVar86 + lVar87 + 4);
                  fVar4 = *(float *)((long)pvVar86 + lVar87 + 8);
                  fVar5 = *(float *)((long)pvVar88 + lVar87);
                  fVar6 = *(float *)((long)pvVar88 + lVar87 + 4);
                  fVar7 = *(float *)((long)pvVar88 + lVar87 + 8);
                  fVar8 = *(float *)((long)pvVar78 + lVar87);
                  fVar9 = *(float *)((long)pvVar78 + lVar87 + 4);
                  puVar1 = (undefined4 *)((long)puVar74 + lVar87 * 2 + 0x40);
                  fVar10 = *(float *)((long)pvVar78 + lVar87 + 8);
                  pauVar66 = (undefined1 (*) [16])(pauVar83[4] + lVar87 * 2);
                  fVar43 = *(float *)pauVar66[-4];
                  fVar42 = *(float *)(pauVar66[-4] + 4);
                  fVar41 = *(float *)(pauVar66[-4] + 8);
                  fVar40 = *(float *)(pauVar66[-4] + 0xc);
                  puVar1[-0x10] =
                       fVar3 * local_188 + fVar4 * local_178 + fVar5 * local_198 + fVar7 * local_1b8
                       + fVar9 * local_108 +
                       fVar2 * local_218 + (float)puVar1[-0x10] + fVar6 * local_f8 +
                       fVar8 * local_1a8 + fVar10 * local_e8;
                  puVar1[-0xf] = fVar3 * fStack_184 + fVar4 * fStack_174 + fVar5 * fStack_194 +
                                 fVar7 * fStack_1b4 + fVar9 * fStack_104 +
                                 fVar2 * fStack_214 + (float)puVar1[-0xf] + fVar6 * fStack_f4 +
                                 fVar8 * fStack_1a4 + fVar10 * fStack_e4;
                  puVar1[-0xe] = fVar3 * fStack_180 + fVar4 * fStack_170 + fVar5 * fStack_190 +
                                 fVar7 * fStack_1b0 + fVar9 * fStack_100 +
                                 fVar2 * fStack_210 + (float)puVar1[-0xe] + fVar6 * fStack_f0 +
                                 fVar8 * fStack_1a0 + fVar10 * fStack_e0;
                  puVar1[-0xd] = fVar3 * fStack_17c + fVar4 * fStack_16c + fVar5 * fStack_18c +
                                 fVar7 * fStack_1ac + fVar9 * fStack_fc +
                                 fVar2 * fStack_20c + (float)puVar1[-0xd] + fVar6 * fStack_ec +
                                 fVar8 * fStack_19c + fVar10 * fStack_dc;
                  *(float *)pauVar66[-4] =
                       fVar10 * local_168 +
                       fVar6 * fVar34 + fVar2 * fVar58 + fVar43 + fVar8 * local_118 +
                       fVar3 * fVar38 + fVar4 * fVar54 + fVar5 * local_138 + fVar7 * local_208 +
                       fVar9 * local_158;
                  *(float *)(pauVar66[-4] + 4) =
                       fVar10 * fStack_164 +
                       fVar6 * fVar33 + fVar2 * fVar59 + fVar42 + fVar8 * fStack_114 +
                       fVar3 * fVar37 + fVar4 * fVar55 + fVar5 * fStack_134 + fVar7 * fStack_204 +
                       fVar9 * fStack_154;
                  *(float *)(pauVar66[-4] + 8) =
                       fVar10 * fStack_160 +
                       fVar6 * fVar32 + fVar2 * fVar60 + fVar41 + fVar8 * fStack_110 +
                       fVar3 * fVar36 + fVar4 * fVar56 + fVar5 * fStack_130 + fVar7 * fStack_200 +
                       fVar9 * fStack_150;
                  *(float *)(pauVar66[-4] + 0xc) =
                       fVar10 * fStack_15c +
                       fVar6 * fVar39 + fVar2 * fVar61 + fVar40 + fVar8 * fStack_10c +
                       fVar3 * fVar35 + fVar4 * fVar57 + fVar5 * fStack_12c + fVar7 * fStack_1fc +
                       fVar9 * fStack_14c;
                  fVar2 = *(float *)((long)pvVar86 + lVar87 + 0xc);
                  fVar3 = *(float *)((long)pvVar88 + lVar87 + 0xc);
                  fVar5 = *(float *)((long)pvVar78 + lVar87 + 0xc);
                  fVar6 = *(float *)((long)pvVar86 + lVar87 + 0x10);
                  fVar8 = *(float *)((long)pvVar88 + lVar87 + 0x10);
                  fVar9 = *(float *)((long)pvVar78 + lVar87 + 0x10);
                  fVar43 = *(float *)pauVar66[-3];
                  fVar42 = *(float *)(pauVar66[-3] + 4);
                  fVar41 = *(float *)(pauVar66[-3] + 8);
                  fVar40 = *(float *)(pauVar66[-3] + 0xc);
                  puVar1[-0xc] = fVar6 * local_178 + fVar8 * local_1b8 + fVar9 * local_e8 +
                                 fVar7 * local_198 + fVar4 * local_218 + (float)puVar1[-0xc] +
                                 fVar10 * local_1a8 + fVar2 * local_188 + fVar3 * local_f8 +
                                 fVar5 * local_108;
                  puVar1[-0xb] = fVar6 * fStack_174 + fVar8 * fStack_1b4 + fVar9 * fStack_e4 +
                                 fVar7 * fStack_194 + fVar4 * fStack_214 + (float)puVar1[-0xb] +
                                 fVar10 * fStack_1a4 + fVar2 * fStack_184 + fVar3 * fStack_f4 +
                                 fVar5 * fStack_104;
                  puVar1[-10] = fVar6 * fStack_170 + fVar8 * fStack_1b0 + fVar9 * fStack_e0 +
                                fVar7 * fStack_190 + fVar4 * fStack_210 + (float)puVar1[-10] +
                                fVar10 * fStack_1a0 + fVar2 * fStack_180 + fVar3 * fStack_f0 +
                                fVar5 * fStack_100;
                  puVar1[-9] = fVar6 * fStack_16c + fVar8 * fStack_1ac + fVar9 * fStack_dc +
                               fVar7 * fStack_18c + fVar4 * fStack_20c + (float)puVar1[-9] +
                               fVar10 * fStack_19c + fVar2 * fStack_17c + fVar3 * fStack_ec +
                               fVar5 * fStack_fc;
                  *(float *)pauVar66[-3] =
                       fVar9 * local_168 +
                       local_138 * fVar7 + fVar4 * fVar58 + fVar10 * local_118 + fVar43 +
                       fVar8 * local_208 +
                       fVar6 * fVar54 + fVar2 * fVar38 + fVar3 * fVar34 + fVar5 * local_158;
                  *(float *)(pauVar66[-3] + 4) =
                       fVar9 * fStack_164 +
                       fStack_134 * fVar7 + fVar4 * fVar59 + fVar10 * fStack_114 + fVar42 +
                       fVar8 * fStack_204 +
                       fVar6 * fVar55 + fVar2 * fVar37 + fVar3 * fVar33 + fVar5 * fStack_154;
                  *(float *)(pauVar66[-3] + 8) =
                       fVar9 * fStack_160 +
                       fStack_130 * fVar7 + fVar4 * fVar60 + fVar10 * fStack_110 + fVar41 +
                       fVar8 * fStack_200 +
                       fVar6 * fVar56 + fVar2 * fVar36 + fVar3 * fVar32 + fVar5 * fStack_150;
                  *(float *)(pauVar66[-3] + 0xc) =
                       fVar9 * fStack_15c +
                       fStack_12c * fVar7 + fVar4 * fVar61 + fVar10 * fStack_10c + fVar40 +
                       fVar8 * fStack_1fc +
                       fVar6 * fVar57 + fVar2 * fVar35 + fVar3 * fVar39 + fVar5 * fStack_14c;
                  fVar2 = *(float *)((long)pvVar86 + lVar87 + 0x14);
                  fVar3 = *(float *)((long)pvVar88 + lVar87 + 0x14);
                  fVar4 = *(float *)((long)pvVar78 + lVar87 + 0x14);
                  fVar5 = *(float *)((long)pvVar86 + lVar87 + 0x18);
                  fVar7 = *(float *)((long)pvVar88 + lVar87 + 0x18);
                  fVar10 = *(float *)((long)pvVar78 + lVar87 + 0x18);
                  fVar43 = *(float *)pauVar66[-2];
                  fVar42 = *(float *)(pauVar66[-2] + 4);
                  fVar41 = *(float *)(pauVar66[-2] + 8);
                  fVar40 = *(float *)(pauVar66[-2] + 0xc);
                  puVar1[-8] = fVar8 * local_198 + fVar6 * local_218 + (float)puVar1[-8] +
                               fVar9 * local_1a8 + fVar2 * local_188 + fVar3 * local_f8 +
                               fVar4 * local_108 +
                               fVar5 * local_178 + fVar7 * local_1b8 + fVar10 * local_e8;
                  puVar1[-7] = fVar8 * fStack_194 + fVar6 * fStack_214 + (float)puVar1[-7] +
                               fVar9 * fStack_1a4 + fVar2 * fStack_184 + fVar3 * fStack_f4 +
                               fVar4 * fStack_104 +
                               fVar5 * fStack_174 + fVar7 * fStack_1b4 + fVar10 * fStack_e4;
                  puVar1[-6] = fVar8 * fStack_190 + fVar6 * fStack_210 + (float)puVar1[-6] +
                               fVar9 * fStack_1a0 + fVar2 * fStack_180 + fVar3 * fStack_f0 +
                               fVar4 * fStack_100 +
                               fVar5 * fStack_170 + fVar7 * fStack_1b0 + fVar10 * fStack_e0;
                  puVar1[-5] = fVar8 * fStack_18c + fVar6 * fStack_20c + (float)puVar1[-5] +
                               fVar9 * fStack_19c + fVar2 * fStack_17c + fVar3 * fStack_ec +
                               fVar4 * fStack_fc +
                               fVar5 * fStack_16c + fVar7 * fStack_1ac + fVar10 * fStack_dc;
                  *(float *)pauVar66[-2] =
                       fVar8 * local_138 + fVar6 * fVar58 + fVar9 * local_118 + fVar43 +
                       fVar7 * local_208 +
                       fVar2 * fVar38 + fVar3 * fVar34 + fVar4 * local_158 + fVar5 * fVar54 +
                       fVar10 * local_168;
                  *(float *)(pauVar66[-2] + 4) =
                       fVar8 * fStack_134 + fVar6 * fVar59 + fVar9 * fStack_114 + fVar42 +
                       fVar7 * fStack_204 +
                       fVar2 * fVar37 + fVar3 * fVar33 + fVar4 * fStack_154 + fVar5 * fVar55 +
                       fVar10 * fStack_164;
                  *(float *)(pauVar66[-2] + 8) =
                       fVar8 * fStack_130 + fVar6 * fVar60 + fVar9 * fStack_110 + fVar41 +
                       fVar7 * fStack_200 +
                       fVar2 * fVar36 + fVar3 * fVar32 + fVar4 * fStack_150 + fVar5 * fVar56 +
                       fVar10 * fStack_160;
                  *(float *)(pauVar66[-2] + 0xc) =
                       fVar8 * fStack_12c + fVar6 * fVar61 + fVar9 * fStack_10c + fVar40 +
                       fVar7 * fStack_1fc +
                       fVar2 * fVar35 + fVar3 * fVar39 + fVar4 * fStack_14c + fVar5 * fVar57 +
                       fVar10 * fStack_15c;
                  fVar2 = *(float *)((long)pvVar86 + lVar87 + 0x1c);
                  fVar3 = *(float *)((long)pvVar88 + lVar87 + 0x1c);
                  fVar4 = *(float *)((long)pvVar78 + lVar87 + 0x1c);
                  fVar6 = *(float *)((long)pvVar86 + lVar87 + 0x20);
                  fVar8 = *(float *)((long)pvVar88 + lVar87 + 0x20);
                  fVar9 = *(float *)((long)pvVar78 + lVar87 + 0x20);
                  auVar104._0_4_ =
                       fVar6 * local_178 + fVar8 * local_1b8 + fVar9 * local_e8 +
                       fVar7 * local_198 + fVar5 * local_218 +
                       fVar10 * local_1a8 + fVar2 * local_188 + fVar3 * local_f8 + fVar4 * local_108
                       + (float)puVar1[-4];
                  auVar104._4_4_ =
                       fVar6 * fStack_174 + fVar8 * fStack_1b4 + fVar9 * fStack_e4 +
                       fVar7 * fStack_194 + fVar5 * fStack_214 +
                       fVar10 * fStack_1a4 + fVar2 * fStack_184 +
                       fVar3 * fStack_f4 + fVar4 * fStack_104 + (float)puVar1[-3];
                  auVar104._8_4_ =
                       fVar6 * fStack_170 + fVar8 * fStack_1b0 + fVar9 * fStack_e0 +
                       fVar7 * fStack_190 + fVar5 * fStack_210 +
                       fVar10 * fStack_1a0 + fVar2 * fStack_180 +
                       fVar3 * fStack_f0 + fVar4 * fStack_100 + (float)puVar1[-2];
                  auVar104._12_4_ =
                       fVar6 * fStack_16c + fVar8 * fStack_1ac + fVar9 * fStack_dc +
                       fVar7 * fStack_18c + fVar5 * fStack_20c +
                       fVar10 * fStack_19c + fVar2 * fStack_17c +
                       fVar3 * fStack_ec + fVar4 * fStack_fc + (float)puVar1[-1];
                  auVar101._0_4_ =
                       fVar7 * local_138 + fVar5 * fVar58 + local_118 * fVar10 + fVar2 * fVar38 +
                       fVar4 * local_158 + fVar3 * fVar34 + fVar6 * fVar54 + *(float *)pauVar66[-1]
                       + fVar8 * local_208 + fVar9 * local_168;
                  auVar101._4_4_ =
                       fVar7 * fStack_134 + fVar5 * fVar59 + fStack_114 * fVar10 + fVar2 * fVar37 +
                       fVar4 * fStack_154 + fVar3 * fVar33 + fVar6 * fVar55 +
                       *(float *)(pauVar66[-1] + 4) + fVar8 * fStack_204 + fVar9 * fStack_164;
                  auVar101._8_4_ =
                       fVar7 * fStack_130 + fVar5 * fVar60 + fStack_110 * fVar10 + fVar2 * fVar36 +
                       fVar4 * fStack_150 + fVar3 * fVar32 + fVar6 * fVar56 +
                       *(float *)(pauVar66[-1] + 8) + fVar8 * fStack_200 + fVar9 * fStack_160;
                  auVar101._12_4_ =
                       fVar7 * fStack_12c + fVar5 * fVar61 + fStack_10c * fVar10 + fVar2 * fVar35 +
                       fVar4 * fStack_14c + fVar3 * fVar39 + fVar6 * fVar57 +
                       *(float *)(pauVar66[-1] + 0xc) + fVar8 * fStack_1fc + fVar9 * fStack_15c;
                  *(undefined1 (*) [16])(puVar1 + -4) = auVar104;
                  pauVar66[-1] = auVar101;
                  iVar77 = iVar77 + 4;
                  lVar87 = lVar87 + 0x20;
                } while (iVar77 < (int)uVar28);
                puVar74 = puVar90 + 0x10;
                pauVar83 = pauVar71 + 4;
                pvVar78 = (void *)((long)pvVar78 + lVar87);
                pvVar88 = (void *)((long)pvVar88 + lVar87);
                pvVar86 = (void *)((long)pvVar86 + lVar87);
                auVar107 = ZEXT1664(auVar94);
                uVar68 = uVar28 & 0xfffffffc;
              }
              if ((int)(uVar68 | 1) < (int)uVar28) {
                lVar87 = 0;
                pauVar66 = pauVar83;
                puVar1 = puVar74;
                uVar67 = uVar68;
                do {
                  puVar90 = puVar1;
                  pauVar71 = pauVar66;
                  fVar2 = *(float *)((long)pvVar86 + lVar87);
                  fVar3 = *(float *)((long)pvVar86 + lVar87 + 4);
                  fVar4 = *(float *)((long)pvVar86 + lVar87 + 8);
                  fVar5 = *(float *)((long)pvVar88 + lVar87);
                  fVar6 = *(float *)((long)pvVar88 + lVar87 + 4);
                  fVar7 = *(float *)((long)pvVar88 + lVar87 + 8);
                  fVar8 = *(float *)((long)pvVar78 + lVar87);
                  fVar9 = *(float *)((long)pvVar78 + lVar87 + 4);
                  fVar10 = *(float *)((long)pvVar78 + lVar87 + 8);
                  puVar1 = (undefined4 *)((long)puVar74 + lVar87 * 2 + 0x20);
                  pauVar66 = (undefined1 (*) [16])(pauVar83[2] + lVar87 * 2);
                  fVar43 = *(float *)pauVar66[-2];
                  fVar42 = *(float *)(pauVar66[-2] + 4);
                  fVar41 = *(float *)(pauVar66[-2] + 8);
                  fVar40 = *(float *)(pauVar66[-2] + 0xc);
                  puVar1[-8] = fVar2 * local_218 + (float)puVar1[-8] + fVar6 * local_f8 +
                               fVar8 * local_1a8 + fVar10 * local_e8 +
                               fVar3 * local_188 + fVar4 * local_178 + fVar5 * local_198 +
                               fVar7 * local_1b8 + fVar9 * local_108;
                  puVar1[-7] = fVar2 * fStack_214 + (float)puVar1[-7] + fVar6 * fStack_f4 +
                               fVar8 * fStack_1a4 + fVar10 * fStack_e4 +
                               fVar3 * fStack_184 + fVar4 * fStack_174 + fVar5 * fStack_194 +
                               fVar7 * fStack_1b4 + fVar9 * fStack_104;
                  puVar1[-6] = fVar2 * fStack_210 + (float)puVar1[-6] + fVar6 * fStack_f0 +
                               fVar8 * fStack_1a0 + fVar10 * fStack_e0 +
                               fVar3 * fStack_180 + fVar4 * fStack_170 + fVar5 * fStack_190 +
                               fVar7 * fStack_1b0 + fVar9 * fStack_100;
                  puVar1[-5] = fVar2 * fStack_20c + (float)puVar1[-5] + fVar6 * fStack_ec +
                               fVar8 * fStack_19c + fVar10 * fStack_dc +
                               fVar3 * fStack_17c + fVar4 * fStack_16c + fVar5 * fStack_18c +
                               fVar7 * fStack_1ac + fVar9 * fStack_fc;
                  *(float *)pauVar66[-2] =
                       fVar10 * local_168 +
                       fVar2 * fVar58 + fVar43 + fVar6 * fVar34 + fVar8 * local_118 +
                       fVar3 * fVar38 + fVar4 * fVar54 + fVar5 * local_138 + fVar7 * local_208 +
                       fVar9 * local_158;
                  *(float *)(pauVar66[-2] + 4) =
                       fVar10 * fStack_164 +
                       fVar2 * fVar59 + fVar42 + fVar6 * fVar33 + fVar8 * fStack_114 +
                       fVar3 * fVar37 + fVar4 * fVar55 + fVar5 * fStack_134 + fVar7 * fStack_204 +
                       fVar9 * fStack_154;
                  *(float *)(pauVar66[-2] + 8) =
                       fVar10 * fStack_160 +
                       fVar2 * fVar60 + fVar41 + fVar6 * fVar32 + fVar8 * fStack_110 +
                       fVar3 * fVar36 + fVar4 * fVar56 + fVar5 * fStack_130 + fVar7 * fStack_200 +
                       fVar9 * fStack_150;
                  *(float *)(pauVar66[-2] + 0xc) =
                       fVar10 * fStack_15c +
                       fVar2 * fVar61 + fVar40 + fVar6 * fVar39 + fVar8 * fStack_10c +
                       fVar3 * fVar35 + fVar4 * fVar57 + fVar5 * fStack_12c + fVar7 * fStack_1fc +
                       fVar9 * fStack_14c;
                  fVar2 = *(float *)((long)pvVar86 + lVar87 + 0xc);
                  fVar3 = *(float *)((long)pvVar88 + lVar87 + 0xc);
                  fVar5 = *(float *)((long)pvVar78 + lVar87 + 0xc);
                  fVar6 = *(float *)((long)pvVar86 + lVar87 + 0x10);
                  fVar8 = *(float *)((long)pvVar88 + lVar87 + 0x10);
                  fVar9 = *(float *)((long)pvVar78 + lVar87 + 0x10);
                  auVar105._0_4_ =
                       fVar6 * local_178 + fVar8 * local_1b8 + fVar9 * local_e8 +
                       fVar10 * local_1a8 + fVar2 * local_188 + fVar3 * local_f8 + fVar5 * local_108
                       + fVar7 * local_198 + fVar4 * local_218 + (float)puVar1[-4];
                  auVar105._4_4_ =
                       fVar6 * fStack_174 + fVar8 * fStack_1b4 + fVar9 * fStack_e4 +
                       fVar10 * fStack_1a4 + fVar2 * fStack_184 + fVar3 * fStack_f4 +
                       fVar5 * fStack_104 +
                       fVar7 * fStack_194 + fVar4 * fStack_214 + (float)puVar1[-3];
                  auVar105._8_4_ =
                       fVar6 * fStack_170 + fVar8 * fStack_1b0 + fVar9 * fStack_e0 +
                       fVar10 * fStack_1a0 + fVar2 * fStack_180 + fVar3 * fStack_f0 +
                       fVar5 * fStack_100 +
                       fVar7 * fStack_190 + fVar4 * fStack_210 + (float)puVar1[-2];
                  auVar105._12_4_ =
                       fVar6 * fStack_16c + fVar8 * fStack_1ac + fVar9 * fStack_dc +
                       fVar10 * fStack_19c + fVar2 * fStack_17c + fVar3 * fStack_ec +
                       fVar5 * fStack_fc +
                       fVar7 * fStack_18c + fVar4 * fStack_20c + (float)puVar1[-1];
                  auVar102._0_4_ =
                       fVar7 * local_138 + fVar58 * fVar4 + local_118 * fVar10 +
                       *(float *)pauVar66[-1] +
                       fVar2 * fVar38 + fVar3 * fVar34 + fVar5 * local_158 + fVar6 * fVar54 +
                       fVar8 * local_208 + fVar9 * local_168;
                  auVar102._4_4_ =
                       fVar7 * fStack_134 + fVar59 * fVar4 + fStack_114 * fVar10 +
                       *(float *)(pauVar66[-1] + 4) +
                       fVar2 * fVar37 + fVar3 * fVar33 + fVar5 * fStack_154 + fVar6 * fVar55 +
                       fVar8 * fStack_204 + fVar9 * fStack_164;
                  auVar102._8_4_ =
                       fVar7 * fStack_130 + fVar60 * fVar4 + fStack_110 * fVar10 +
                       *(float *)(pauVar66[-1] + 8) +
                       fVar2 * fVar36 + fVar3 * fVar32 + fVar5 * fStack_150 + fVar6 * fVar56 +
                       fVar8 * fStack_200 + fVar9 * fStack_160;
                  auVar102._12_4_ =
                       fVar7 * fStack_12c + fVar61 * fVar4 + fStack_10c * fVar10 +
                       *(float *)(pauVar66[-1] + 0xc) +
                       fVar2 * fVar35 + fVar3 * fVar39 + fVar5 * fStack_14c + fVar6 * fVar57 +
                       fVar8 * fStack_1fc + fVar9 * fStack_15c;
                  *(undefined1 (*) [16])(puVar1 + -4) = auVar105;
                  pauVar66[-1] = auVar102;
                  uVar68 = uVar67 + 2;
                  iVar77 = uVar67 + 3;
                  lVar87 = lVar87 + 0x10;
                  uVar67 = uVar68;
                } while (iVar77 < (int)uVar28);
                puVar74 = puVar90 + 8;
                pauVar83 = pauVar71 + 2;
                pvVar78 = (void *)((long)pvVar78 + lVar87);
                pvVar88 = (void *)((long)pvVar88 + lVar87);
                pvVar86 = (void *)((long)pvVar86 + lVar87);
                auVar107 = ZEXT1664(auVar94);
              }
              iVar77 = uVar28 - uVar68;
              if (iVar77 != 0 && (int)uVar68 <= (int)uVar28) {
                lVar87 = 0;
                lVar70 = 0;
                auVar108 = auVar107;
                do {
                  fVar2 = *(float *)((long)pvVar86 + lVar70);
                  fVar3 = *(float *)((long)pvVar86 + lVar70 + 4);
                  fVar4 = *(float *)((long)pvVar86 + lVar70 + 8);
                  fVar5 = *(float *)((long)pvVar88 + lVar70);
                  fVar6 = *(float *)((long)pvVar88 + lVar70 + 4);
                  fVar7 = *(float *)((long)pvVar88 + lVar70 + 8);
                  fVar8 = *(float *)((long)pvVar78 + lVar70);
                  fVar9 = *(float *)((long)pvVar78 + lVar70 + 4);
                  fVar10 = *(float *)((long)pvVar78 + lVar70 + 8);
                  pfVar84 = (float *)((long)puVar74 + lVar70 * 2);
                  auVar106._0_4_ =
                       fVar2 * local_218 + *pfVar84 + fVar6 * local_f8 + fVar8 * local_1a8 +
                       fVar10 * local_e8 +
                       fVar3 * local_188 + fVar4 * local_178 + fVar5 * local_198 + fVar7 * local_1b8
                       + fVar9 * local_108;
                  auVar106._4_4_ =
                       fVar2 * fStack_214 + pfVar84[1] + fVar6 * fStack_f4 + fVar8 * fStack_1a4 +
                       fVar10 * fStack_e4 +
                       fVar3 * fStack_184 + fVar4 * fStack_174 + fVar5 * fStack_194 +
                       fVar7 * fStack_1b4 + fVar9 * fStack_104;
                  auVar106._8_4_ =
                       fVar2 * fStack_210 + pfVar84[2] + fVar6 * fStack_f0 + fVar8 * fStack_1a0 +
                       fVar10 * fStack_e0 +
                       fVar3 * fStack_180 + fVar4 * fStack_170 + fVar5 * fStack_190 +
                       fVar7 * fStack_1b0 + fVar9 * fStack_100;
                  auVar106._12_4_ =
                       fVar2 * fStack_20c + pfVar84[3] + fVar6 * fStack_ec + fVar8 * fStack_19c +
                       fVar10 * fStack_dc +
                       fVar3 * fStack_17c + fVar4 * fStack_16c + fVar5 * fStack_18c +
                       fVar7 * fStack_1ac + fVar9 * fStack_fc;
                  auVar107 = ZEXT1664(auVar108._0_16_);
                  pfVar84 = (float *)((long)*pauVar83 + lVar70 * 2);
                  auVar103._0_4_ =
                       fVar6 * fVar34 + fVar58 * fVar2 + *pfVar84 + fVar8 * local_118 +
                       fVar10 * local_168 +
                       fVar5 * auVar108._0_4_ + fVar4 * fVar54 + fVar38 * fVar3 + fVar7 * local_208
                       + fVar9 * local_158;
                  auVar103._4_4_ =
                       fVar6 * fVar33 + fVar59 * fVar2 + pfVar84[1] + fVar8 * fStack_114 +
                       fVar10 * fStack_164 +
                       fVar5 * auVar108._4_4_ + fVar4 * fVar55 + fVar37 * fVar3 + fVar7 * fStack_204
                       + fVar9 * fStack_154;
                  auVar103._8_4_ =
                       fVar6 * fVar32 + fVar60 * fVar2 + pfVar84[2] + fVar8 * fStack_110 +
                       fVar10 * fStack_160 +
                       fVar5 * auVar108._8_4_ + fVar4 * fVar56 + fVar36 * fVar3 + fVar7 * fStack_200
                       + fVar9 * fStack_150;
                  auVar103._12_4_ =
                       fVar6 * fVar39 + fVar61 * fVar2 + pfVar84[3] + fVar8 * fStack_10c +
                       fVar10 * fStack_15c +
                       fVar5 * auVar108._12_4_ + fVar4 * fVar57 + fVar35 * fVar3 +
                       fVar7 * fStack_1fc + fVar9 * fStack_14c;
                  *(undefined1 (*) [16])((long)puVar74 + lVar70 * 2) = auVar106;
                  *(undefined1 (*) [16])((long)*pauVar83 + lVar70 * 2) = auVar103;
                  lVar70 = lVar70 + 8;
                  lVar87 = lVar87 + -0x10;
                  iVar77 = iVar77 + -1;
                  auVar108 = auVar107;
                } while (iVar77 != 0);
                pvVar78 = (void *)((long)pvVar78 + lVar70);
                pvVar88 = (void *)((long)pvVar88 + lVar70);
                pvVar86 = (void *)((long)pvVar86 + lVar70);
                pauVar83 = (undefined1 (*) [16])((long)pauVar83 - lVar87);
                puVar74 = (undefined4 *)((long)puVar74 - lVar87);
              }
              pvVar86 = (void *)((long)pvVar86 + lVar91 * 4);
              pvVar88 = (void *)((long)pvVar88 + lVar91 * 4);
              pvVar78 = (void *)((long)pvVar78 + lVar91 * 4);
              iVar73 = iVar73 + 1;
            } while (iVar73 != iVar29);
          }
          local_98 = local_98 + 0x12;
          pfVar75 = pfVar75 + 0x24;
          local_148 = local_148 + 1;
        } while (local_148 != uVar27);
      }
      uVar85 = uVar85 + 1;
    } while (uVar85 != (uint)(iVar30 >> 1));
  }
  if ((int)uVar82 != iVar30) {
    do {
      uVar81 = (long)top_blob->h * (long)top_blob->w;
      uVar85 = top_blob->elemsize;
      uVar69 = (uVar85 * uVar81 + 0xf & 0xfffffffffffffff0) / uVar85;
      if (top_blob->dims == 4) {
        uVar69 = uVar81;
      }
      if (pvVar31 == (void *)0x0) {
        auVar92 = ZEXT816(0) << 0x40;
      }
      else {
        auVar92 = *(undefined1 (*) [16])((long)pvVar31 + uVar82 * 0x10);
      }
      pauVar83 = (undefined1 (*) [16])(top_blob->cstep * uVar82 * uVar85 + (long)top_blob->data);
      iVar73 = (int)uVar69 * top_blob->d;
      pauVar72 = pauVar83;
      if (0 < iVar73) {
        do {
          *pauVar72 = auVar92;
          iVar73 = iVar73 + -1;
          pauVar72 = pauVar72 + 1;
        } while (iVar73 != 0);
      }
      if (0 < (int)uVar27) {
        pfVar75 = (float *)(kernel->cstep * uVar82 * kernel->elemsize + (long)kernel->data);
        uVar85 = 0;
        do {
          if (0 < iVar29) {
            fVar58 = *pfVar75;
            fVar59 = pfVar75[1];
            fVar60 = pfVar75[2];
            fVar61 = pfVar75[3];
            fVar54 = pfVar75[4];
            fVar55 = pfVar75[5];
            fVar56 = pfVar75[6];
            fVar57 = pfVar75[7];
            auVar92 = *(undefined1 (*) [16])(pfVar75 + 8);
            auVar20 = *(undefined1 (*) [16])(pfVar75 + 0xc);
            auVar21 = *(undefined1 (*) [16])(pfVar75 + 0x10);
            auVar22 = *(undefined1 (*) [16])(pfVar75 + 0x14);
            auVar23 = *(undefined1 (*) [16])(pfVar75 + 0x18);
            auVar24 = *(undefined1 (*) [16])(pfVar75 + 0x1c);
            auVar25 = *(undefined1 (*) [16])(pfVar75 + 0x20);
            pfVar76 = (float *)(bottom_blob->cstep * uVar85 * bottom_blob->elemsize +
                               (long)bottom_blob->data);
            lVar87 = (long)bottom_blob->w * bottom_blob->elemsize;
            pfVar84 = (float *)((long)pfVar76 + lVar87 * 2);
            pfVar89 = (float *)(lVar87 + (long)pfVar76);
            iVar73 = 0;
            pauVar72 = pauVar83;
            do {
              fVar7 = auVar20._4_4_;
              fVar40 = auVar20._8_4_;
              fVar44 = auVar20._12_4_;
              fVar39 = auVar92._4_4_;
              fVar41 = auVar92._8_4_;
              fVar45 = auVar92._12_4_;
              fVar2 = auVar22._4_4_;
              fVar42 = auVar22._8_4_;
              fVar46 = auVar22._12_4_;
              fVar3 = auVar23._4_4_;
              fVar8 = auVar23._8_4_;
              fVar47 = auVar23._12_4_;
              fVar4 = auVar21._4_4_;
              fVar43 = auVar21._8_4_;
              fVar48 = auVar21._12_4_;
              fVar5 = auVar24._4_4_;
              fVar10 = auVar24._8_4_;
              fVar49 = auVar24._12_4_;
              fVar6 = auVar25._4_4_;
              fVar9 = auVar25._8_4_;
              fVar50 = auVar25._12_4_;
              fVar32 = auVar92._0_4_;
              fVar33 = auVar20._0_4_;
              fVar34 = auVar21._0_4_;
              fVar35 = auVar22._0_4_;
              fVar36 = auVar23._0_4_;
              fVar37 = auVar24._0_4_;
              fVar38 = auVar25._0_4_;
              if ((int)uVar28 < 8) {
                uVar68 = 0;
              }
              else {
                iVar77 = 7;
                do {
                  fVar11 = *pfVar76;
                  fVar12 = pfVar76[1];
                  fVar13 = pfVar76[2];
                  fVar14 = *pfVar89;
                  fVar15 = pfVar89[1];
                  fVar16 = pfVar89[2];
                  fVar17 = *pfVar84;
                  fVar18 = pfVar84[1];
                  fVar51 = *(float *)((long)*pauVar72 + 4);
                  fVar52 = *(float *)((long)*pauVar72 + 8);
                  fVar53 = *(float *)((long)*pauVar72 + 0xc);
                  fVar19 = pfVar84[2];
                  *(float *)*pauVar72 =
                       fVar11 * fVar58 + *(float *)*pauVar72 + fVar15 * fVar34 + fVar17 * fVar36 +
                       fVar19 * fVar38 +
                       fVar12 * fVar54 + fVar13 * fVar32 + fVar14 * fVar33 + fVar16 * fVar35 +
                       fVar18 * fVar37;
                  *(float *)((long)*pauVar72 + 4) =
                       fVar11 * fVar59 + fVar51 + fVar15 * fVar4 + fVar17 * fVar3 + fVar19 * fVar6 +
                       fVar12 * fVar55 + fVar13 * fVar39 + fVar14 * fVar7 + fVar16 * fVar2 +
                       fVar18 * fVar5;
                  *(float *)((long)*pauVar72 + 8) =
                       fVar11 * fVar60 + fVar52 + fVar15 * fVar43 + fVar17 * fVar8 + fVar19 * fVar9
                       + fVar12 * fVar56 + fVar13 * fVar41 + fVar14 * fVar40 + fVar16 * fVar42 +
                         fVar18 * fVar10;
                  *(float *)((long)*pauVar72 + 0xc) =
                       fVar11 * fVar61 + fVar53 + fVar15 * fVar48 + fVar17 * fVar47 +
                       fVar19 * fVar50 +
                       fVar12 * fVar57 + fVar13 * fVar45 + fVar14 * fVar44 + fVar16 * fVar46 +
                       fVar18 * fVar49;
                  fVar11 = pfVar76[3];
                  fVar12 = pfVar76[4];
                  fVar14 = pfVar89[4];
                  fVar15 = pfVar89[3];
                  fVar17 = pfVar84[3];
                  fVar18 = pfVar84[4];
                  fVar51 = *(float *)(pauVar72[1] + 4);
                  fVar52 = *(float *)(pauVar72[1] + 8);
                  fVar53 = *(float *)(pauVar72[1] + 0xc);
                  *(float *)pauVar72[1] =
                       fVar16 * fVar33 + fVar13 * fVar58 + *(float *)pauVar72[1] +
                       fVar19 * fVar36 + fVar11 * fVar54 + fVar15 * fVar34 + fVar17 * fVar37 +
                       fVar12 * fVar32 + fVar14 * fVar35 + fVar18 * fVar38;
                  *(float *)(pauVar72[1] + 4) =
                       fVar16 * fVar7 + fVar13 * fVar59 + fVar51 +
                       fVar19 * fVar3 + fVar11 * fVar55 + fVar15 * fVar4 + fVar17 * fVar5 +
                       fVar12 * fVar39 + fVar14 * fVar2 + fVar18 * fVar6;
                  *(float *)(pauVar72[1] + 8) =
                       fVar16 * fVar40 + fVar13 * fVar60 + fVar52 +
                       fVar19 * fVar8 + fVar11 * fVar56 + fVar15 * fVar43 + fVar17 * fVar10 +
                       fVar12 * fVar41 + fVar14 * fVar42 + fVar18 * fVar9;
                  *(float *)(pauVar72[1] + 0xc) =
                       fVar16 * fVar44 + fVar13 * fVar61 + fVar53 +
                       fVar19 * fVar47 + fVar11 * fVar57 + fVar15 * fVar48 + fVar17 * fVar49 +
                       fVar12 * fVar45 + fVar14 * fVar46 + fVar18 * fVar50;
                  fVar11 = pfVar76[5];
                  fVar13 = pfVar89[5];
                  fVar51 = *(float *)(pauVar72[2] + 4);
                  fVar52 = *(float *)(pauVar72[2] + 8);
                  fVar53 = *(float *)(pauVar72[2] + 0xc);
                  fVar15 = pfVar84[5];
                  fVar16 = pfVar76[6];
                  fVar17 = pfVar89[6];
                  fVar19 = pfVar84[6];
                  *(float *)pauVar72[2] =
                       fVar12 * fVar58 + *(float *)pauVar72[2] + fVar13 * fVar34 + fVar16 * fVar32 +
                       fVar19 * fVar38 +
                       fVar14 * fVar33 + fVar18 * fVar36 + fVar11 * fVar54 + fVar15 * fVar37 +
                       fVar17 * fVar35;
                  *(float *)(pauVar72[2] + 4) =
                       fVar12 * fVar59 + fVar51 + fVar13 * fVar4 + fVar16 * fVar39 + fVar19 * fVar6
                       + fVar14 * fVar7 + fVar18 * fVar3 + fVar11 * fVar55 + fVar15 * fVar5 +
                         fVar17 * fVar2;
                  *(float *)(pauVar72[2] + 8) =
                       fVar12 * fVar60 + fVar52 + fVar13 * fVar43 + fVar16 * fVar41 + fVar19 * fVar9
                       + fVar14 * fVar40 + fVar18 * fVar8 + fVar11 * fVar56 + fVar15 * fVar10 +
                         fVar17 * fVar42;
                  *(float *)(pauVar72[2] + 0xc) =
                       fVar12 * fVar61 + fVar53 + fVar13 * fVar48 + fVar16 * fVar45 +
                       fVar19 * fVar50 +
                       fVar14 * fVar44 + fVar18 * fVar47 + fVar11 * fVar57 + fVar15 * fVar49 +
                       fVar17 * fVar46;
                  fVar11 = pfVar76[7];
                  fVar12 = pfVar76[8];
                  fVar13 = pfVar89[8];
                  fVar14 = pfVar89[7];
                  fVar15 = pfVar84[7];
                  fVar18 = pfVar84[8];
                  fVar51 = *(float *)(pauVar72[3] + 4);
                  fVar52 = *(float *)(pauVar72[3] + 8);
                  fVar53 = *(float *)(pauVar72[3] + 0xc);
                  *(float *)pauVar72[3] =
                       fVar12 * fVar32 + fVar13 * fVar35 + fVar18 * fVar38 +
                       fVar14 * fVar34 + fVar15 * fVar37 +
                       fVar19 * fVar36 + fVar11 * fVar54 + fVar16 * fVar58 + fVar17 * fVar33 +
                       *(float *)pauVar72[3];
                  *(float *)(pauVar72[3] + 4) =
                       fVar12 * fVar39 + fVar13 * fVar2 + fVar18 * fVar6 +
                       fVar14 * fVar4 + fVar15 * fVar5 +
                       fVar19 * fVar3 + fVar11 * fVar55 + fVar16 * fVar59 + fVar17 * fVar7 + fVar51;
                  *(float *)(pauVar72[3] + 8) =
                       fVar12 * fVar41 + fVar13 * fVar42 + fVar18 * fVar9 +
                       fVar14 * fVar43 + fVar15 * fVar10 +
                       fVar19 * fVar8 + fVar11 * fVar56 + fVar16 * fVar60 + fVar17 * fVar40 + fVar52
                  ;
                  *(float *)(pauVar72[3] + 0xc) =
                       fVar12 * fVar45 + fVar13 * fVar46 + fVar18 * fVar50 +
                       fVar14 * fVar48 + fVar15 * fVar49 +
                       fVar19 * fVar47 + fVar11 * fVar57 + fVar16 * fVar61 + fVar17 * fVar44 +
                       fVar53;
                  fVar11 = pfVar76[9];
                  fVar14 = pfVar76[10];
                  fVar15 = pfVar89[10];
                  fVar16 = pfVar89[9];
                  fVar17 = pfVar84[9];
                  fVar19 = pfVar84[10];
                  fVar51 = *(float *)(pauVar72[4] + 4);
                  fVar52 = *(float *)(pauVar72[4] + 8);
                  fVar53 = *(float *)(pauVar72[4] + 0xc);
                  *(float *)pauVar72[4] =
                       fVar14 * fVar32 + fVar15 * fVar35 + fVar19 * fVar38 +
                       fVar16 * fVar34 + fVar17 * fVar37 +
                       fVar13 * fVar33 + fVar12 * fVar58 + fVar18 * fVar36 + fVar11 * fVar54 +
                       *(float *)pauVar72[4];
                  *(float *)(pauVar72[4] + 4) =
                       fVar14 * fVar39 + fVar15 * fVar2 + fVar19 * fVar6 +
                       fVar16 * fVar4 + fVar17 * fVar5 +
                       fVar13 * fVar7 + fVar12 * fVar59 + fVar18 * fVar3 + fVar11 * fVar55 + fVar51;
                  *(float *)(pauVar72[4] + 8) =
                       fVar14 * fVar41 + fVar15 * fVar42 + fVar19 * fVar9 +
                       fVar16 * fVar43 + fVar17 * fVar10 +
                       fVar13 * fVar40 + fVar12 * fVar60 + fVar18 * fVar8 + fVar11 * fVar56 + fVar52
                  ;
                  *(float *)(pauVar72[4] + 0xc) =
                       fVar14 * fVar45 + fVar15 * fVar46 + fVar19 * fVar50 +
                       fVar16 * fVar48 + fVar17 * fVar49 +
                       fVar13 * fVar44 + fVar12 * fVar61 + fVar18 * fVar47 + fVar11 * fVar57 +
                       fVar53;
                  fVar11 = pfVar76[0xb];
                  fVar12 = pfVar76[0xc];
                  fVar13 = pfVar89[0xc];
                  fVar16 = pfVar89[0xb];
                  fVar17 = pfVar84[0xb];
                  fVar18 = pfVar84[0xc];
                  fVar51 = *(float *)(pauVar72[5] + 4);
                  fVar52 = *(float *)(pauVar72[5] + 8);
                  fVar53 = *(float *)(pauVar72[5] + 0xc);
                  *(float *)pauVar72[5] =
                       fVar12 * fVar32 + fVar13 * fVar35 + fVar18 * fVar38 +
                       fVar16 * fVar34 + fVar17 * fVar37 +
                       fVar15 * fVar33 + fVar14 * fVar58 + fVar19 * fVar36 + fVar11 * fVar54 +
                       *(float *)pauVar72[5];
                  *(float *)(pauVar72[5] + 4) =
                       fVar12 * fVar39 + fVar13 * fVar2 + fVar18 * fVar6 +
                       fVar16 * fVar4 + fVar17 * fVar5 +
                       fVar15 * fVar7 + fVar14 * fVar59 + fVar19 * fVar3 + fVar11 * fVar55 + fVar51;
                  *(float *)(pauVar72[5] + 8) =
                       fVar12 * fVar41 + fVar13 * fVar42 + fVar18 * fVar9 +
                       fVar16 * fVar43 + fVar17 * fVar10 +
                       fVar15 * fVar40 + fVar14 * fVar60 + fVar19 * fVar8 + fVar11 * fVar56 + fVar52
                  ;
                  *(float *)(pauVar72[5] + 0xc) =
                       fVar12 * fVar45 + fVar13 * fVar46 + fVar18 * fVar50 +
                       fVar16 * fVar48 + fVar17 * fVar49 +
                       fVar15 * fVar44 + fVar14 * fVar61 + fVar19 * fVar47 + fVar11 * fVar57 +
                       fVar53;
                  fVar11 = pfVar76[0xd];
                  fVar14 = pfVar76[0xe];
                  fVar15 = pfVar89[0xe];
                  fVar16 = pfVar89[0xd];
                  fVar17 = pfVar84[0xd];
                  fVar19 = pfVar84[0xe];
                  fVar51 = *(float *)(pauVar72[6] + 4);
                  fVar52 = *(float *)(pauVar72[6] + 8);
                  fVar53 = *(float *)(pauVar72[6] + 0xc);
                  *(float *)pauVar72[6] =
                       fVar14 * fVar32 + fVar15 * fVar35 + fVar19 * fVar38 +
                       fVar16 * fVar34 + fVar17 * fVar37 +
                       fVar13 * fVar33 + fVar12 * fVar58 + fVar18 * fVar36 + fVar11 * fVar54 +
                       *(float *)pauVar72[6];
                  *(float *)(pauVar72[6] + 4) =
                       fVar14 * fVar39 + fVar15 * fVar2 + fVar19 * fVar6 +
                       fVar16 * fVar4 + fVar17 * fVar5 +
                       fVar13 * fVar7 + fVar12 * fVar59 + fVar18 * fVar3 + fVar11 * fVar55 + fVar51;
                  *(float *)(pauVar72[6] + 8) =
                       fVar14 * fVar41 + fVar15 * fVar42 + fVar19 * fVar9 +
                       fVar16 * fVar43 + fVar17 * fVar10 +
                       fVar13 * fVar40 + fVar12 * fVar60 + fVar18 * fVar8 + fVar11 * fVar56 + fVar52
                  ;
                  *(float *)(pauVar72[6] + 0xc) =
                       fVar14 * fVar45 + fVar15 * fVar46 + fVar19 * fVar50 +
                       fVar16 * fVar48 + fVar17 * fVar49 +
                       fVar13 * fVar44 + fVar12 * fVar61 + fVar18 * fVar47 + fVar11 * fVar57 +
                       fVar53;
                  fVar11 = pfVar76[0x10];
                  fVar12 = pfVar89[0x10];
                  fVar13 = pfVar76[0xf];
                  fVar16 = pfVar89[0xf];
                  fVar17 = pfVar84[0xf];
                  fVar18 = pfVar84[0x10];
                  auVar93._0_4_ =
                       fVar11 * fVar32 + fVar12 * fVar35 + fVar18 * fVar38 +
                       fVar16 * fVar34 + fVar17 * fVar37 +
                       fVar19 * fVar36 + fVar13 * fVar54 + fVar15 * fVar33 + fVar14 * fVar58 +
                       *(float *)pauVar72[7];
                  auVar93._4_4_ =
                       fVar11 * fVar39 + fVar12 * fVar2 + fVar18 * fVar6 +
                       fVar16 * fVar4 + fVar17 * fVar5 +
                       fVar19 * fVar3 + fVar13 * fVar55 + fVar15 * fVar7 + fVar14 * fVar59 +
                       *(float *)(pauVar72[7] + 4);
                  auVar93._8_4_ =
                       fVar11 * fVar41 + fVar12 * fVar42 + fVar18 * fVar9 +
                       fVar16 * fVar43 + fVar17 * fVar10 +
                       fVar19 * fVar8 + fVar13 * fVar56 + fVar15 * fVar40 + fVar14 * fVar60 +
                       *(float *)(pauVar72[7] + 8);
                  auVar93._12_4_ =
                       fVar11 * fVar45 + fVar12 * fVar46 + fVar18 * fVar50 +
                       fVar16 * fVar48 + fVar17 * fVar49 +
                       fVar19 * fVar47 + fVar13 * fVar57 + fVar15 * fVar44 + fVar14 * fVar61 +
                       *(float *)(pauVar72[7] + 0xc);
                  pauVar72[7] = auVar93;
                  pfVar76 = pfVar76 + 0x10;
                  pfVar89 = pfVar89 + 0x10;
                  pfVar84 = pfVar84 + 0x10;
                  pauVar72 = pauVar72 + 8;
                  iVar77 = iVar77 + 8;
                  uVar68 = uVar28 & 0xfffffff8;
                } while (iVar77 < (int)uVar28);
              }
              if ((int)(uVar68 | 3) < (int)uVar28) {
                lVar87 = 0;
                pauVar66 = pauVar72;
                uVar67 = uVar68;
                do {
                  pauVar71 = pauVar66;
                  fVar11 = *(float *)((long)pfVar76 + lVar87);
                  fVar12 = *(float *)((long)pfVar76 + lVar87 + 4);
                  fVar13 = *(float *)((long)pfVar76 + lVar87 + 8);
                  fVar14 = *(float *)((long)pfVar89 + lVar87);
                  fVar15 = *(float *)((long)pfVar89 + lVar87 + 4);
                  fVar16 = *(float *)((long)pfVar89 + lVar87 + 8);
                  fVar17 = *(float *)((long)pfVar84 + lVar87);
                  fVar18 = *(float *)((long)pfVar84 + lVar87 + 4);
                  pauVar66 = (undefined1 (*) [16])(pauVar72[4] + lVar87 * 2);
                  fVar51 = *(float *)(pauVar66[-4] + 4);
                  fVar52 = *(float *)(pauVar66[-4] + 8);
                  fVar53 = *(float *)(pauVar66[-4] + 0xc);
                  fVar19 = *(float *)((long)pfVar84 + lVar87 + 8);
                  *(float *)pauVar66[-4] =
                       fVar12 * fVar54 + fVar13 * fVar32 + fVar14 * fVar33 + fVar16 * fVar35 +
                       fVar18 * fVar37 +
                       fVar19 * fVar38 +
                       fVar17 * fVar36 + fVar15 * fVar34 + fVar58 * fVar11 + *(float *)pauVar66[-4];
                  *(float *)(pauVar66[-4] + 4) =
                       fVar12 * fVar55 + fVar13 * fVar39 + fVar14 * fVar7 + fVar16 * fVar2 +
                       fVar18 * fVar5 +
                       fVar19 * fVar6 + fVar17 * fVar3 + fVar15 * fVar4 + fVar59 * fVar11 + fVar51;
                  *(float *)(pauVar66[-4] + 8) =
                       fVar12 * fVar56 + fVar13 * fVar41 + fVar14 * fVar40 + fVar16 * fVar42 +
                       fVar18 * fVar10 +
                       fVar19 * fVar9 + fVar17 * fVar8 + fVar15 * fVar43 + fVar60 * fVar11 + fVar52;
                  *(float *)(pauVar66[-4] + 0xc) =
                       fVar12 * fVar57 + fVar13 * fVar45 + fVar14 * fVar44 + fVar16 * fVar46 +
                       fVar18 * fVar49 +
                       fVar19 * fVar50 +
                       fVar17 * fVar47 + fVar15 * fVar48 + fVar61 * fVar11 + fVar53;
                  fVar11 = *(float *)((long)pfVar76 + lVar87 + 0xc);
                  fVar12 = *(float *)((long)pfVar76 + lVar87 + 0x10);
                  fVar14 = *(float *)((long)pfVar89 + lVar87 + 0x10);
                  fVar15 = *(float *)((long)pfVar89 + lVar87 + 0xc);
                  fVar17 = *(float *)((long)pfVar84 + lVar87 + 0xc);
                  fVar18 = *(float *)((long)pfVar84 + lVar87 + 0x10);
                  fVar51 = *(float *)(pauVar66[-3] + 4);
                  fVar52 = *(float *)(pauVar66[-3] + 8);
                  fVar53 = *(float *)(pauVar66[-3] + 0xc);
                  *(float *)pauVar66[-3] =
                       fVar12 * fVar32 + fVar14 * fVar35 + fVar18 * fVar38 +
                       fVar16 * fVar33 + fVar13 * fVar58 + *(float *)pauVar66[-3] +
                       fVar17 * fVar37 + fVar15 * fVar34 + fVar19 * fVar36 + fVar11 * fVar54;
                  *(float *)(pauVar66[-3] + 4) =
                       fVar12 * fVar39 + fVar14 * fVar2 + fVar18 * fVar6 +
                       fVar16 * fVar7 + fVar13 * fVar59 + fVar51 +
                       fVar17 * fVar5 + fVar15 * fVar4 + fVar19 * fVar3 + fVar11 * fVar55;
                  *(float *)(pauVar66[-3] + 8) =
                       fVar12 * fVar41 + fVar14 * fVar42 + fVar18 * fVar9 +
                       fVar16 * fVar40 + fVar13 * fVar60 + fVar52 +
                       fVar17 * fVar10 + fVar15 * fVar43 + fVar19 * fVar8 + fVar11 * fVar56;
                  *(float *)(pauVar66[-3] + 0xc) =
                       fVar12 * fVar45 + fVar14 * fVar46 + fVar18 * fVar50 +
                       fVar16 * fVar44 + fVar13 * fVar61 + fVar53 +
                       fVar17 * fVar49 + fVar15 * fVar48 + fVar19 * fVar47 + fVar11 * fVar57;
                  fVar11 = *(float *)((long)pfVar76 + lVar87 + 0x14);
                  fVar13 = *(float *)((long)pfVar89 + lVar87 + 0x14);
                  fVar51 = *(float *)(pauVar66[-2] + 4);
                  fVar52 = *(float *)(pauVar66[-2] + 8);
                  fVar53 = *(float *)(pauVar66[-2] + 0xc);
                  fVar15 = *(float *)((long)pfVar76 + lVar87 + 0x18);
                  fVar16 = *(float *)((long)pfVar84 + lVar87 + 0x14);
                  fVar17 = *(float *)((long)pfVar89 + lVar87 + 0x18);
                  fVar19 = *(float *)((long)pfVar84 + lVar87 + 0x18);
                  *(float *)pauVar66[-2] =
                       fVar12 * fVar58 + *(float *)pauVar66[-2] + fVar13 * fVar34 + fVar15 * fVar32
                       + fVar19 * fVar38 +
                       fVar17 * fVar35 +
                       fVar16 * fVar37 + fVar14 * fVar33 + fVar18 * fVar36 + fVar11 * fVar54;
                  *(float *)(pauVar66[-2] + 4) =
                       fVar12 * fVar59 + fVar51 + fVar13 * fVar4 + fVar15 * fVar39 + fVar19 * fVar6
                       + fVar17 * fVar2 +
                         fVar16 * fVar5 + fVar14 * fVar7 + fVar18 * fVar3 + fVar11 * fVar55;
                  *(float *)(pauVar66[-2] + 8) =
                       fVar12 * fVar60 + fVar52 + fVar13 * fVar43 + fVar15 * fVar41 + fVar19 * fVar9
                       + fVar17 * fVar42 +
                         fVar16 * fVar10 + fVar14 * fVar40 + fVar18 * fVar8 + fVar11 * fVar56;
                  *(float *)(pauVar66[-2] + 0xc) =
                       fVar12 * fVar61 + fVar53 + fVar13 * fVar48 + fVar15 * fVar45 +
                       fVar19 * fVar50 +
                       fVar17 * fVar46 +
                       fVar16 * fVar49 + fVar14 * fVar44 + fVar18 * fVar47 + fVar11 * fVar57;
                  fVar11 = *(float *)((long)pfVar76 + lVar87 + 0x20);
                  fVar12 = *(float *)((long)pfVar89 + lVar87 + 0x20);
                  fVar13 = *(float *)((long)pfVar76 + lVar87 + 0x1c);
                  fVar14 = *(float *)((long)pfVar89 + lVar87 + 0x1c);
                  fVar16 = *(float *)((long)pfVar84 + lVar87 + 0x1c);
                  fVar18 = *(float *)((long)pfVar84 + lVar87 + 0x20);
                  auVar94._0_4_ =
                       fVar17 * fVar33 + fVar15 * fVar58 + fVar19 * fVar36 + fVar13 * fVar54 +
                       fVar14 * fVar34 + fVar16 * fVar37 + *(float *)pauVar66[-1] +
                       fVar18 * fVar38 + fVar12 * fVar35 + fVar11 * fVar32;
                  auVar94._4_4_ =
                       fVar17 * fVar7 + fVar15 * fVar59 + fVar19 * fVar3 + fVar13 * fVar55 +
                       fVar14 * fVar4 + fVar16 * fVar5 + *(float *)(pauVar66[-1] + 4) +
                       fVar18 * fVar6 + fVar12 * fVar2 + fVar11 * fVar39;
                  auVar94._8_4_ =
                       fVar17 * fVar40 + fVar15 * fVar60 + fVar19 * fVar8 + fVar13 * fVar56 +
                       fVar14 * fVar43 + fVar16 * fVar10 + *(float *)(pauVar66[-1] + 8) +
                       fVar18 * fVar9 + fVar12 * fVar42 + fVar11 * fVar41;
                  auVar94._12_4_ =
                       fVar17 * fVar44 + fVar15 * fVar61 + fVar19 * fVar47 + fVar13 * fVar57 +
                       fVar14 * fVar48 + fVar16 * fVar49 + *(float *)(pauVar66[-1] + 0xc) +
                       fVar18 * fVar50 + fVar12 * fVar46 + fVar11 * fVar45;
                  pauVar66[-1] = auVar94;
                  uVar68 = uVar67 + 4;
                  iVar77 = uVar67 + 7;
                  lVar87 = lVar87 + 0x20;
                  uVar67 = uVar68;
                } while (iVar77 < (int)uVar28);
                pauVar72 = pauVar71 + 4;
                pfVar84 = (float *)((long)pfVar84 + lVar87);
                pfVar89 = (float *)((long)pfVar89 + lVar87);
                pfVar76 = (float *)((long)pfVar76 + lVar87);
              }
              if ((int)(uVar68 | 1) < (int)uVar28) {
                lVar87 = 0;
                pauVar66 = pauVar72;
                uVar67 = uVar68;
                do {
                  pauVar71 = pauVar66;
                  fVar11 = *(float *)((long)pfVar76 + lVar87);
                  fVar12 = *(float *)((long)pfVar76 + lVar87 + 4);
                  fVar13 = *(float *)((long)pfVar76 + lVar87 + 8);
                  fVar14 = *(float *)((long)pfVar89 + lVar87);
                  fVar15 = *(float *)((long)pfVar89 + lVar87 + 4);
                  fVar16 = *(float *)((long)pfVar89 + lVar87 + 8);
                  fVar17 = *(float *)((long)pfVar84 + lVar87);
                  pauVar66 = (undefined1 (*) [16])(pauVar72[2] + lVar87 * 2);
                  fVar51 = *(float *)(pauVar66[-2] + 4);
                  fVar52 = *(float *)(pauVar66[-2] + 8);
                  fVar53 = *(float *)(pauVar66[-2] + 0xc);
                  fVar18 = *(float *)((long)pfVar84 + lVar87 + 4);
                  fVar19 = *(float *)((long)pfVar84 + lVar87 + 8);
                  *(float *)pauVar66[-2] =
                       fVar12 * fVar54 + fVar13 * fVar32 + fVar14 * fVar33 + fVar16 * fVar35 +
                       fVar18 * fVar37 +
                       fVar19 * fVar38 +
                       fVar17 * fVar36 + fVar15 * fVar34 + fVar58 * fVar11 + *(float *)pauVar66[-2];
                  *(float *)(pauVar66[-2] + 4) =
                       fVar12 * fVar55 + fVar13 * fVar39 + fVar14 * fVar7 + fVar16 * fVar2 +
                       fVar18 * fVar5 +
                       fVar19 * fVar6 + fVar17 * fVar3 + fVar15 * fVar4 + fVar59 * fVar11 + fVar51;
                  *(float *)(pauVar66[-2] + 8) =
                       fVar12 * fVar56 + fVar13 * fVar41 + fVar14 * fVar40 + fVar16 * fVar42 +
                       fVar18 * fVar10 +
                       fVar19 * fVar9 + fVar17 * fVar8 + fVar15 * fVar43 + fVar60 * fVar11 + fVar52;
                  *(float *)(pauVar66[-2] + 0xc) =
                       fVar12 * fVar57 + fVar13 * fVar45 + fVar14 * fVar44 + fVar16 * fVar46 +
                       fVar18 * fVar49 +
                       fVar19 * fVar50 +
                       fVar17 * fVar47 + fVar15 * fVar48 + fVar61 * fVar11 + fVar53;
                  fVar11 = *(float *)((long)pfVar76 + lVar87 + 0x10);
                  fVar12 = *(float *)((long)pfVar89 + lVar87 + 0x10);
                  fVar14 = *(float *)((long)pfVar76 + lVar87 + 0xc);
                  fVar15 = *(float *)((long)pfVar89 + lVar87 + 0xc);
                  fVar17 = *(float *)((long)pfVar84 + lVar87 + 0xc);
                  fVar18 = *(float *)((long)pfVar84 + lVar87 + 0x10);
                  auVar95._0_4_ =
                       fVar16 * fVar33 + fVar13 * fVar58 + *(float *)pauVar66[-1] +
                       fVar19 * fVar36 + fVar14 * fVar54 + fVar15 * fVar34 + fVar17 * fVar37 +
                       fVar18 * fVar38 + fVar12 * fVar35 + fVar11 * fVar32;
                  auVar95._4_4_ =
                       fVar16 * fVar7 + fVar13 * fVar59 + *(float *)(pauVar66[-1] + 4) +
                       fVar19 * fVar3 + fVar14 * fVar55 + fVar15 * fVar4 + fVar17 * fVar5 +
                       fVar18 * fVar6 + fVar12 * fVar2 + fVar11 * fVar39;
                  auVar95._8_4_ =
                       fVar16 * fVar40 + fVar13 * fVar60 + *(float *)(pauVar66[-1] + 8) +
                       fVar19 * fVar8 + fVar14 * fVar56 + fVar15 * fVar43 + fVar17 * fVar10 +
                       fVar18 * fVar9 + fVar12 * fVar42 + fVar11 * fVar41;
                  auVar95._12_4_ =
                       fVar16 * fVar44 + fVar13 * fVar61 + *(float *)(pauVar66[-1] + 0xc) +
                       fVar19 * fVar47 + fVar14 * fVar57 + fVar15 * fVar48 + fVar17 * fVar49 +
                       fVar18 * fVar50 + fVar12 * fVar46 + fVar11 * fVar45;
                  pauVar66[-1] = auVar95;
                  uVar68 = uVar67 + 2;
                  iVar77 = uVar67 + 3;
                  lVar87 = lVar87 + 0x10;
                  uVar67 = uVar68;
                } while (iVar77 < (int)uVar28);
                pauVar72 = pauVar71 + 2;
                pfVar84 = (float *)((long)pfVar84 + lVar87);
                pfVar89 = (float *)((long)pfVar89 + lVar87);
                pfVar76 = (float *)((long)pfVar76 + lVar87);
              }
              if ((int)uVar68 < (int)uVar28) {
                lVar87 = 0;
                lVar70 = 0;
                do {
                  fVar11 = pfVar76[lVar70 * 2];
                  fVar12 = pfVar76[lVar70 * 2 + 1];
                  fVar13 = pfVar76[lVar70 * 2 + 2];
                  fVar14 = pfVar89[lVar70 * 2];
                  fVar15 = pfVar89[lVar70 * 2 + 1];
                  fVar16 = pfVar89[lVar70 * 2 + 2];
                  fVar17 = pfVar84[lVar70 * 2];
                  fVar18 = pfVar84[lVar70 * 2 + 1];
                  fVar19 = pfVar84[lVar70 * 2 + 2];
                  auVar96._0_4_ =
                       fVar12 * fVar54 + fVar13 * fVar32 + fVar14 * fVar33 + fVar16 * fVar35 +
                       fVar18 * fVar37 +
                       fVar19 * fVar38 +
                       fVar17 * fVar36 + fVar15 * fVar34 + fVar58 * fVar11 + *(float *)*pauVar72;
                  auVar96._4_4_ =
                       fVar12 * fVar55 + fVar13 * fVar39 + fVar14 * fVar7 + fVar16 * fVar2 +
                       fVar18 * fVar5 +
                       fVar19 * fVar6 +
                       fVar17 * fVar3 +
                       fVar15 * fVar4 + fVar59 * fVar11 + *(float *)((long)*pauVar72 + 4);
                  auVar96._8_4_ =
                       fVar12 * fVar56 + fVar13 * fVar41 + fVar14 * fVar40 + fVar16 * fVar42 +
                       fVar18 * fVar10 +
                       fVar19 * fVar9 +
                       fVar17 * fVar8 +
                       fVar15 * fVar43 + fVar60 * fVar11 + *(float *)((long)*pauVar72 + 8);
                  auVar96._12_4_ =
                       fVar12 * fVar57 + fVar13 * fVar45 + fVar14 * fVar44 + fVar16 * fVar46 +
                       fVar18 * fVar49 +
                       fVar19 * fVar50 +
                       fVar17 * fVar47 +
                       fVar15 * fVar48 + fVar61 * fVar11 + *(float *)((long)*pauVar72 + 0xc);
                  *pauVar72 = auVar96;
                  pauVar72 = pauVar72 + 1;
                  lVar70 = lVar70 + 1;
                  lVar87 = lVar87 + -8;
                } while (uVar28 - uVar68 != (int)lVar70);
                pfVar84 = (float *)((long)pfVar84 - lVar87);
                pfVar89 = (float *)((long)pfVar89 - lVar87);
                pfVar76 = (float *)((long)pfVar76 - lVar87);
              }
              pfVar76 = pfVar76 + lVar91;
              pfVar89 = pfVar89 + lVar91;
              pfVar84 = pfVar84 + lVar91;
              iVar73 = iVar73 + 1;
            } while (iVar73 != iVar29);
          }
          pfVar75 = pfVar75 + 0x24;
          uVar85 = uVar85 + 1;
        } while (uVar85 != uVar27);
      }
      uVar82 = uVar82 + 1;
    } while ((long)uVar82 < (long)iVar30);
  }
  return;
}

Assistant:

static void conv3x3s2_pack1to4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const float* bias = _bias;
    int nn_outch = outch >> 1;
    int remain_outch_start = nn_outch << 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 2;

        Mat out0 = top_blob.channel(p);
        Mat out1 = top_blob.channel(p + 1);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + p * 4) : _mm_set1_ps(0.f);
        __m128 _bias1 = bias ? _mm_loadu_ps((const float*)bias + (p + 1) * 4) : _mm_set1_ps(0.f);
        out0.fill(_bias0);
        out1.fill(_bias1);

        const float* k0 = kernel.channel(p);
        const float* k1 = kernel.channel(p + 1);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0;
            float* outptr1 = out1;

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m128 _k00_0 = _mm_loadu_ps(k0);
            __m128 _k01_0 = _mm_loadu_ps(k0 + 4);
            __m128 _k02_0 = _mm_loadu_ps(k0 + 8);
            __m128 _k10_0 = _mm_loadu_ps(k0 + 12);
            __m128 _k11_0 = _mm_loadu_ps(k0 + 16);
            __m128 _k12_0 = _mm_loadu_ps(k0 + 20);
            __m128 _k20_0 = _mm_loadu_ps(k0 + 24);
            __m128 _k21_0 = _mm_loadu_ps(k0 + 28);
            __m128 _k22_0 = _mm_loadu_ps(k0 + 32);

            __m128 _k00_1 = _mm_loadu_ps(k1);
            __m128 _k01_1 = _mm_loadu_ps(k1 + 4);
            __m128 _k02_1 = _mm_loadu_ps(k1 + 8);
            __m128 _k10_1 = _mm_loadu_ps(k1 + 12);
            __m128 _k11_1 = _mm_loadu_ps(k1 + 16);
            __m128 _k12_1 = _mm_loadu_ps(k1 + 20);
            __m128 _k20_1 = _mm_loadu_ps(k1 + 24);
            __m128 _k21_1 = _mm_loadu_ps(k1 + 28);
            __m128 _k22_1 = _mm_loadu_ps(k1 + 32);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;

                for (; j + 3 < outw; j += 4)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _sum10 = _mm_loadu_ps(outptr1);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm_storeu_ps(outptr0, _sum00);
                    _mm_storeu_ps(outptr1, _sum10);

                    __m128 _sum01 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _sum11 = _mm_loadu_ps(outptr1 + 4);

                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));
                    __m128 _r05 = _mm_set1_ps(*(r0 + 4));
                    __m128 _r15 = _mm_set1_ps(*(r1 + 4));
                    __m128 _r25 = _mm_set1_ps(*(r2 + 4));

                    _sum01 = _mm_comp_fmadd_ps(_r03, _k00_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r04, _k01_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r05, _k02_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r13, _k10_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r14, _k11_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r15, _k12_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r23, _k20_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r24, _k21_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r25, _k22_0, _sum01);

                    _sum11 = _mm_comp_fmadd_ps(_r03, _k00_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r04, _k01_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r05, _k02_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r13, _k10_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r14, _k11_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r15, _k12_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r23, _k20_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r24, _k21_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r25, _k22_1, _sum11);

                    _mm_storeu_ps(outptr0 + 4, _sum01);
                    _mm_storeu_ps(outptr1 + 4, _sum11);

                    __m128 _sum02 = _mm_loadu_ps(outptr0 + 8);
                    __m128 _sum12 = _mm_loadu_ps(outptr1 + 8);

                    __m128 _r06 = _mm_set1_ps(*(r0 + 5));
                    __m128 _r16 = _mm_set1_ps(*(r1 + 5));
                    __m128 _r26 = _mm_set1_ps(*(r2 + 5));
                    __m128 _r07 = _mm_set1_ps(*(r0 + 6));
                    __m128 _r17 = _mm_set1_ps(*(r1 + 6));
                    __m128 _r27 = _mm_set1_ps(*(r2 + 6));

                    _sum02 = _mm_comp_fmadd_ps(_r05, _k00_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r06, _k01_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r07, _k02_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r15, _k10_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r16, _k11_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r17, _k12_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r25, _k20_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r26, _k21_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r27, _k22_0, _sum02);

                    _sum12 = _mm_comp_fmadd_ps(_r05, _k00_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r06, _k01_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r07, _k02_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r15, _k10_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r16, _k11_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r17, _k12_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r25, _k20_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r26, _k21_1, _sum12);
                    _sum12 = _mm_comp_fmadd_ps(_r27, _k22_1, _sum12);

                    _mm_storeu_ps(outptr0 + 8, _sum02);
                    _mm_storeu_ps(outptr1 + 8, _sum12);

                    __m128 _r08 = _mm_set1_ps(*(r0 + 7));
                    __m128 _r18 = _mm_set1_ps(*(r1 + 7));
                    __m128 _r28 = _mm_set1_ps(*(r2 + 7));
                    __m128 _r09 = _mm_set1_ps(*(r0 + 8));
                    __m128 _r19 = _mm_set1_ps(*(r1 + 8));
                    __m128 _r29 = _mm_set1_ps(*(r2 + 8));

                    __m128 _sum03 = _mm_loadu_ps(outptr0 + 12);
                    __m128 _sum13 = _mm_loadu_ps(outptr1 + 12);

                    _sum03 = _mm_comp_fmadd_ps(_r07, _k00_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r08, _k01_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r09, _k02_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r17, _k10_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r18, _k11_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r19, _k12_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r27, _k20_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r28, _k21_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r29, _k22_0, _sum03);

                    _sum13 = _mm_comp_fmadd_ps(_r07, _k00_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r08, _k01_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r09, _k02_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r17, _k10_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r18, _k11_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r19, _k12_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r27, _k20_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r28, _k21_1, _sum13);
                    _sum13 = _mm_comp_fmadd_ps(_r29, _k22_1, _sum13);

                    _mm_storeu_ps(outptr0 + 12, _sum03);
                    _mm_storeu_ps(outptr1 + 12, _sum13);
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                    outptr0 += 16;
                    outptr1 += 16;
                }

                for (; j + 1 < outw; j += 2)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _sum10 = _mm_loadu_ps(outptr1);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm_storeu_ps(outptr0, _sum00);
                    _mm_storeu_ps(outptr1, _sum10);

                    __m128 _sum01 = _mm_loadu_ps(outptr0 + 4);
                    __m128 _sum11 = _mm_loadu_ps(outptr1 + 4);

                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));
                    __m128 _r05 = _mm_set1_ps(*(r0 + 4));
                    __m128 _r15 = _mm_set1_ps(*(r1 + 4));
                    __m128 _r25 = _mm_set1_ps(*(r2 + 4));

                    _sum01 = _mm_comp_fmadd_ps(_r03, _k00_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r04, _k01_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r05, _k02_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r13, _k10_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r14, _k11_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r15, _k12_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r23, _k20_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r24, _k21_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r25, _k22_0, _sum01);

                    _sum11 = _mm_comp_fmadd_ps(_r03, _k00_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r04, _k01_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r05, _k02_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r13, _k10_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r14, _k11_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r15, _k12_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r23, _k20_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r24, _k21_1, _sum11);
                    _sum11 = _mm_comp_fmadd_ps(_r25, _k22_1, _sum11);

                    _mm_storeu_ps(outptr0 + 4, _sum01);
                    _mm_storeu_ps(outptr1 + 4, _sum11);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 8;
                    outptr1 += 8;
                }
                for (; j < outw; j++)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _sum10 = _mm_loadu_ps(outptr1);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm_storeu_ps(outptr0, _sum00);
                    _mm_storeu_ps(outptr1, _sum10);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 4;
                    outptr1 += 4;
                }
                r0 += tailstep;
                r1 += tailstep;
                r2 += tailstep;
            }

            k0 += 9 * 4;
            k1 += 9 * 4;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + p * 4) : _mm_set1_ps(0.f);
        out0.fill(_bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m128 _k00_0 = _mm_loadu_ps(k0);
            __m128 _k01_0 = _mm_loadu_ps(k0 + 4);
            __m128 _k02_0 = _mm_loadu_ps(k0 + 8);
            __m128 _k10_0 = _mm_loadu_ps(k0 + 12);
            __m128 _k11_0 = _mm_loadu_ps(k0 + 16);
            __m128 _k12_0 = _mm_loadu_ps(k0 + 20);
            __m128 _k20_0 = _mm_loadu_ps(k0 + 24);
            __m128 _k21_0 = _mm_loadu_ps(k0 + 28);
            __m128 _k22_0 = _mm_loadu_ps(k0 + 32);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;
                for (; j + 7 < outw; j += 8)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _mm_storeu_ps(outptr0, _sum00);

                    __m128 _sum01 = _mm_loadu_ps(outptr0 + 4);

                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));
                    __m128 _r05 = _mm_set1_ps(*(r0 + 4));
                    __m128 _r15 = _mm_set1_ps(*(r1 + 4));
                    __m128 _r25 = _mm_set1_ps(*(r2 + 4));

                    _sum01 = _mm_comp_fmadd_ps(_r03, _k00_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r04, _k01_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r05, _k02_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r13, _k10_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r14, _k11_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r15, _k12_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r23, _k20_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r24, _k21_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r25, _k22_0, _sum01);

                    _mm_storeu_ps(outptr0 + 4, _sum01);

                    __m128 _sum02 = _mm_loadu_ps(outptr0 + 8);

                    __m128 _r06 = _mm_set1_ps(*(r0 + 5));
                    __m128 _r16 = _mm_set1_ps(*(r1 + 5));
                    __m128 _r26 = _mm_set1_ps(*(r2 + 5));
                    __m128 _r07 = _mm_set1_ps(*(r0 + 6));
                    __m128 _r17 = _mm_set1_ps(*(r1 + 6));
                    __m128 _r27 = _mm_set1_ps(*(r2 + 6));

                    _sum02 = _mm_comp_fmadd_ps(_r05, _k00_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r06, _k01_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r07, _k02_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r15, _k10_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r16, _k11_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r17, _k12_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r25, _k20_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r26, _k21_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r27, _k22_0, _sum02);

                    _mm_storeu_ps(outptr0 + 8, _sum02);

                    __m128 _r08 = _mm_set1_ps(*(r0 + 7));
                    __m128 _r18 = _mm_set1_ps(*(r1 + 7));
                    __m128 _r28 = _mm_set1_ps(*(r2 + 7));
                    __m128 _r09 = _mm_set1_ps(*(r0 + 8));
                    __m128 _r19 = _mm_set1_ps(*(r1 + 8));
                    __m128 _r29 = _mm_set1_ps(*(r2 + 8));

                    __m128 _sum03 = _mm_loadu_ps(outptr0 + 12);

                    _sum03 = _mm_comp_fmadd_ps(_r07, _k00_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r08, _k01_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r09, _k02_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r17, _k10_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r18, _k11_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r19, _k12_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r27, _k20_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r28, _k21_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r29, _k22_0, _sum03);

                    _mm_storeu_ps(outptr0 + 12, _sum03);

                    __m128 _r010 = _mm_set1_ps(*(r0 + 9));
                    __m128 _r110 = _mm_set1_ps(*(r1 + 9));
                    __m128 _r210 = _mm_set1_ps(*(r2 + 9));
                    __m128 _r011 = _mm_set1_ps(*(r0 + 10));
                    __m128 _r111 = _mm_set1_ps(*(r1 + 10));
                    __m128 _r211 = _mm_set1_ps(*(r2 + 10));

                    __m128 _sum04 = _mm_loadu_ps(outptr0 + 16);

                    _sum04 = _mm_comp_fmadd_ps(_r09, _k00_0, _sum04);
                    _sum04 = _mm_comp_fmadd_ps(_r010, _k01_0, _sum04);
                    _sum04 = _mm_comp_fmadd_ps(_r011, _k02_0, _sum04);
                    _sum04 = _mm_comp_fmadd_ps(_r19, _k10_0, _sum04);
                    _sum04 = _mm_comp_fmadd_ps(_r110, _k11_0, _sum04);
                    _sum04 = _mm_comp_fmadd_ps(_r111, _k12_0, _sum04);
                    _sum04 = _mm_comp_fmadd_ps(_r29, _k20_0, _sum04);
                    _sum04 = _mm_comp_fmadd_ps(_r210, _k21_0, _sum04);
                    _sum04 = _mm_comp_fmadd_ps(_r211, _k22_0, _sum04);

                    _mm_storeu_ps(outptr0 + 16, _sum04);

                    __m128 _r012 = _mm_set1_ps(*(r0 + 11));
                    __m128 _r112 = _mm_set1_ps(*(r1 + 11));
                    __m128 _r212 = _mm_set1_ps(*(r2 + 11));
                    __m128 _r013 = _mm_set1_ps(*(r0 + 12));
                    __m128 _r113 = _mm_set1_ps(*(r1 + 12));
                    __m128 _r213 = _mm_set1_ps(*(r2 + 12));

                    __m128 _sum05 = _mm_loadu_ps(outptr0 + 20);

                    _sum05 = _mm_comp_fmadd_ps(_r011, _k00_0, _sum05);
                    _sum05 = _mm_comp_fmadd_ps(_r012, _k01_0, _sum05);
                    _sum05 = _mm_comp_fmadd_ps(_r013, _k02_0, _sum05);
                    _sum05 = _mm_comp_fmadd_ps(_r111, _k10_0, _sum05);
                    _sum05 = _mm_comp_fmadd_ps(_r112, _k11_0, _sum05);
                    _sum05 = _mm_comp_fmadd_ps(_r113, _k12_0, _sum05);
                    _sum05 = _mm_comp_fmadd_ps(_r211, _k20_0, _sum05);
                    _sum05 = _mm_comp_fmadd_ps(_r212, _k21_0, _sum05);
                    _sum05 = _mm_comp_fmadd_ps(_r213, _k22_0, _sum05);

                    _mm_storeu_ps(outptr0 + 20, _sum05);

                    __m128 _r014 = _mm_set1_ps(*(r0 + 13));
                    __m128 _r114 = _mm_set1_ps(*(r1 + 13));
                    __m128 _r214 = _mm_set1_ps(*(r2 + 13));
                    __m128 _r015 = _mm_set1_ps(*(r0 + 14));
                    __m128 _r115 = _mm_set1_ps(*(r1 + 14));
                    __m128 _r215 = _mm_set1_ps(*(r2 + 14));

                    __m128 _sum06 = _mm_loadu_ps(outptr0 + 24);

                    _sum06 = _mm_comp_fmadd_ps(_r013, _k00_0, _sum06);
                    _sum06 = _mm_comp_fmadd_ps(_r014, _k01_0, _sum06);
                    _sum06 = _mm_comp_fmadd_ps(_r015, _k02_0, _sum06);
                    _sum06 = _mm_comp_fmadd_ps(_r113, _k10_0, _sum06);
                    _sum06 = _mm_comp_fmadd_ps(_r114, _k11_0, _sum06);
                    _sum06 = _mm_comp_fmadd_ps(_r115, _k12_0, _sum06);
                    _sum06 = _mm_comp_fmadd_ps(_r213, _k20_0, _sum06);
                    _sum06 = _mm_comp_fmadd_ps(_r214, _k21_0, _sum06);
                    _sum06 = _mm_comp_fmadd_ps(_r215, _k22_0, _sum06);

                    _mm_storeu_ps(outptr0 + 24, _sum06);

                    __m128 _r016 = _mm_set1_ps(*(r0 + 15));
                    __m128 _r116 = _mm_set1_ps(*(r1 + 15));
                    __m128 _r216 = _mm_set1_ps(*(r2 + 15));
                    __m128 _r017 = _mm_set1_ps(*(r0 + 16));
                    __m128 _r117 = _mm_set1_ps(*(r1 + 16));
                    __m128 _r217 = _mm_set1_ps(*(r2 + 16));

                    __m128 _sum07 = _mm_loadu_ps(outptr0 + 28);

                    _sum07 = _mm_comp_fmadd_ps(_r015, _k00_0, _sum07);
                    _sum07 = _mm_comp_fmadd_ps(_r016, _k01_0, _sum07);
                    _sum07 = _mm_comp_fmadd_ps(_r017, _k02_0, _sum07);
                    _sum07 = _mm_comp_fmadd_ps(_r115, _k10_0, _sum07);
                    _sum07 = _mm_comp_fmadd_ps(_r116, _k11_0, _sum07);
                    _sum07 = _mm_comp_fmadd_ps(_r117, _k12_0, _sum07);
                    _sum07 = _mm_comp_fmadd_ps(_r215, _k20_0, _sum07);
                    _sum07 = _mm_comp_fmadd_ps(_r216, _k21_0, _sum07);
                    _sum07 = _mm_comp_fmadd_ps(_r217, _k22_0, _sum07);

                    _mm_storeu_ps(outptr0 + 28, _sum07);

                    r0 += 16;
                    r1 += 16;
                    r2 += 16;
                    outptr0 += 32;
                }

                for (; j + 3 < outw; j += 4)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _mm_storeu_ps(outptr0, _sum00);

                    __m128 _sum01 = _mm_loadu_ps(outptr0 + 4);

                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));
                    __m128 _r05 = _mm_set1_ps(*(r0 + 4));
                    __m128 _r15 = _mm_set1_ps(*(r1 + 4));
                    __m128 _r25 = _mm_set1_ps(*(r2 + 4));

                    _sum01 = _mm_comp_fmadd_ps(_r03, _k00_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r04, _k01_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r05, _k02_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r13, _k10_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r14, _k11_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r15, _k12_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r23, _k20_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r24, _k21_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r25, _k22_0, _sum01);

                    _mm_storeu_ps(outptr0 + 4, _sum01);

                    __m128 _sum02 = _mm_loadu_ps(outptr0 + 8);

                    __m128 _r06 = _mm_set1_ps(*(r0 + 5));
                    __m128 _r16 = _mm_set1_ps(*(r1 + 5));
                    __m128 _r26 = _mm_set1_ps(*(r2 + 5));
                    __m128 _r07 = _mm_set1_ps(*(r0 + 6));
                    __m128 _r17 = _mm_set1_ps(*(r1 + 6));
                    __m128 _r27 = _mm_set1_ps(*(r2 + 6));

                    _sum02 = _mm_comp_fmadd_ps(_r05, _k00_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r06, _k01_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r07, _k02_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r15, _k10_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r16, _k11_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r17, _k12_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r25, _k20_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r26, _k21_0, _sum02);
                    _sum02 = _mm_comp_fmadd_ps(_r27, _k22_0, _sum02);

                    _mm_storeu_ps(outptr0 + 8, _sum02);

                    __m128 _r08 = _mm_set1_ps(*(r0 + 7));
                    __m128 _r18 = _mm_set1_ps(*(r1 + 7));
                    __m128 _r28 = _mm_set1_ps(*(r2 + 7));
                    __m128 _r09 = _mm_set1_ps(*(r0 + 8));
                    __m128 _r19 = _mm_set1_ps(*(r1 + 8));
                    __m128 _r29 = _mm_set1_ps(*(r2 + 8));

                    __m128 _sum03 = _mm_loadu_ps(outptr0 + 12);

                    _sum03 = _mm_comp_fmadd_ps(_r07, _k00_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r08, _k01_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r09, _k02_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r17, _k10_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r18, _k11_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r19, _k12_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r27, _k20_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r28, _k21_0, _sum03);
                    _sum03 = _mm_comp_fmadd_ps(_r29, _k22_0, _sum03);

                    _mm_storeu_ps(outptr0 + 12, _sum03);
                    r0 += 8;
                    r1 += 8;
                    r2 += 8;
                    outptr0 += 16;
                }

                for (; j + 1 < outw; j += 2)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);

                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _mm_storeu_ps(outptr0, _sum00);

                    __m128 _sum01 = _mm_loadu_ps(outptr0 + 4);

                    __m128 _r04 = _mm_set1_ps(*(r0 + 3));
                    __m128 _r14 = _mm_set1_ps(*(r1 + 3));
                    __m128 _r24 = _mm_set1_ps(*(r2 + 3));
                    __m128 _r05 = _mm_set1_ps(*(r0 + 4));
                    __m128 _r15 = _mm_set1_ps(*(r1 + 4));
                    __m128 _r25 = _mm_set1_ps(*(r2 + 4));

                    _sum01 = _mm_comp_fmadd_ps(_r03, _k00_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r04, _k01_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r05, _k02_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r13, _k10_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r14, _k11_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r15, _k12_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r23, _k20_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r24, _k21_0, _sum01);
                    _sum01 = _mm_comp_fmadd_ps(_r25, _k22_0, _sum01);

                    _mm_storeu_ps(outptr0 + 4, _sum01);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 8;
                }
                for (; j < outw; j++)
                {
                    __m128 _sum00 = _mm_loadu_ps(outptr0);
                    __m128 _r01 = _mm_set1_ps(*(r0));
                    __m128 _r02 = _mm_set1_ps(*(r0 + 1));
                    __m128 _r03 = _mm_set1_ps(*(r0 + 2));
                    __m128 _r11 = _mm_set1_ps(*(r1));
                    __m128 _r12 = _mm_set1_ps(*(r1 + 1));
                    __m128 _r13 = _mm_set1_ps(*(r1 + 2));
                    __m128 _r21 = _mm_set1_ps(*(r2));
                    __m128 _r22 = _mm_set1_ps(*(r2 + 1));
                    __m128 _r23 = _mm_set1_ps(*(r2 + 2));

                    _sum00 = _mm_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm_comp_fmadd_ps(_r23, _k22_0, _sum00);
                    _mm_storeu_ps(outptr0, _sum00);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 4;
                }
                r0 += tailstep;
                r1 += tailstep;
                r2 += tailstep;
            }

            k0 += 9 * 4;
        }
    }
}